

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

void LZ4_resetStream_fast(LZ4_stream_t *ctx)

{
  if (((ctx->internal_donotuse).tableType != 0) &&
     (((ctx->internal_donotuse).tableType != 2 ||
      (0x40000000 < (ctx->internal_donotuse).currentOffset)))) {
    memset(ctx,0,0x4008);
  }
  if ((ctx->internal_donotuse).currentOffset != 0) {
    (ctx->internal_donotuse).currentOffset = (ctx->internal_donotuse).currentOffset + 0x10000;
  }
  ctx->table[0x801] = (void *)0x0;
  ctx->table[0x802] = (void *)0x0;
  (ctx->internal_donotuse).dictSize = 0;
  return;
}

Assistant:

void LZ4_resetStream_fast(LZ4_stream_t* ctx) {
    LZ4_prepareTable(&(ctx->internal_donotuse), 0, byU32);
}